

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int backupTruncateFile(sqlite3_file *pFile,i64 iSize)

{
  long lVar1;
  int iVar2;
  sqlite3_file *in_RSI;
  long in_FS_OFFSET;
  int rc;
  i64 iCurrent;
  uint in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = sqlite3OsFileSize(in_RSI,(i64 *)CONCAT44(in_stack_ffffffffffffffdc,
                                                   in_stack_ffffffffffffffd8));
  if ((iVar2 == 0) && ((long)in_RSI < -0x5555555555555556)) {
    iVar2 = sqlite3OsTruncate(in_RSI,(ulong)in_stack_ffffffffffffffd8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return iVar2;
  }
  __stack_chk_fail();
}

Assistant:

static int backupTruncateFile(sqlite3_file *pFile, i64 iSize){
  i64 iCurrent;
  int rc = sqlite3OsFileSize(pFile, &iCurrent);
  if( rc==SQLITE_OK && iCurrent>iSize ){
    rc = sqlite3OsTruncate(pFile, iSize);
  }
  return rc;
}